

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Initialize(ImGuiContext *context)

{
  ImGuiViewportP *this;
  ImGuiViewportP **ppIVar1;
  ImVector<ImGuiViewport_*> *this_00;
  byte local_89;
  ImGuiViewportP *local_88 [4];
  ImGuiViewportP *local_68;
  ImGuiViewportP *viewport;
  ImGuiSettingsHandler ini_handler;
  ImGuiContext *g;
  ImGuiContext *context_local;
  
  local_89 = 0;
  if ((context->Initialized & 1U) == 0) {
    local_89 = context->SettingsLoaded ^ 0xff;
  }
  ini_handler.UserData = context;
  if ((local_89 & 1) == 0) {
    __assert_fail("!g.Initialized && !g.SettingsLoaded",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x1030,"void ImGui::Initialize(ImGuiContext *)");
  }
  ImGuiSettingsHandler::ImGuiSettingsHandler((ImGuiSettingsHandler *)&viewport);
  viewport = (ImGuiViewportP *)0x1e547b;
  ini_handler.TypeName._0_4_ = ImHashStr("Window",0,0);
  ini_handler._8_8_ = WindowSettingsHandler_ClearAll;
  ini_handler.ReadInitFn = WindowSettingsHandler_ReadOpen;
  ini_handler.ReadOpenFn = WindowSettingsHandler_ReadLine;
  ini_handler.ReadLineFn = WindowSettingsHandler_ApplyAll;
  ini_handler.ApplyAllFn = WindowSettingsHandler_WriteAll;
  ImVector<ImGuiSettingsHandler>::push_back
            ((ImVector<ImGuiSettingsHandler> *)((long)ini_handler.UserData + 0x2fd0),
             (ImGuiSettingsHandler *)&viewport);
  MemAlloc(0x130);
  this = (ImGuiViewportP *)operator_new(0x130);
  ImGuiViewportP::ImGuiViewportP(this);
  (this->super_ImGuiViewport).ID = 0x11111111;
  *(undefined4 *)&(this->super_ImGuiViewport).field_0x64 = 0;
  this->PlatformWindowCreated = true;
  local_68 = this;
  ImVector<ImGuiViewportP_*>::push_back
            ((ImVector<ImGuiViewportP_*> *)((long)ini_handler.UserData + 0x1d38),&local_68);
  ppIVar1 = ImVector<ImGuiViewportP_*>::operator[]
                      ((ImVector<ImGuiViewportP_*> *)((long)ini_handler.UserData + 0x1d38),0);
  *(ImGuiViewportP **)((long)ini_handler.UserData + 0x1628) = *ppIVar1;
  this_00 = (ImVector<ImGuiViewport_*> *)((long)ini_handler.UserData + 0x1630);
  ppIVar1 = ImVector<ImGuiViewportP_*>::operator[]
                      ((ImVector<ImGuiViewportP_*> *)((long)ini_handler.UserData + 0x1d38),0);
  local_88[0] = *ppIVar1;
  ImVector<ImGuiViewport_*>::push_back(this_00,(ImGuiViewport **)local_88);
  DockContextInitialize((ImGuiContext *)ini_handler.UserData);
  *(undefined1 *)ini_handler.UserData = 1;
  return;
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

#ifdef IMGUI_HAS_TABLE
    // Add .ini handle for ImGuiTable type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Table";
        ini_handler.TypeHash = ImHashStr("Table");
        ini_handler.ReadOpenFn = TableSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = TableSettingsHandler_ReadLine;
        ini_handler.WriteAllFn = TableSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    viewport->ID = IMGUI_VIEWPORT_DEFAULT_ID;
    viewport->Idx = 0;
    viewport->PlatformWindowCreated = true;
    g.Viewports.push_back(viewport);
    g.PlatformIO.MainViewport = g.Viewports[0]; // Make it accessible in public-facing GetPlatformIO() immediately (before the first call to EndFrame)
    g.PlatformIO.Viewports.push_back(g.Viewports[0]);

    // Extensions
    DockContextInitialize(&g);
#endif // #ifdef IMGUI_HAS_DOCK

    g.Initialized = true;
}